

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::edit_distance::CreateUnifiedDiff
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *left,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *right,size_t context)

{
  EditType EVar1;
  char edit;
  ulong uVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  _List_node_base *p_Var7;
  size_t sVar8;
  ulong uVar9;
  bool bVar10;
  ulong local_268;
  long local_260;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  edits;
  Hunk hunk;
  stringstream ss;
  ostream local_1a8 [376];
  
  CalculateOptimalEdits(&edits,left,right);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  local_268 = 0;
  uVar9 = 0;
  local_260 = 0;
  do {
    uVar5 = (long)edits.
                  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)edits.
                  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2;
    if (uVar5 <= uVar9) {
LAB_001ce6c6:
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::
      _Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
      ::~_Vector_base(&edits.
                       super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                     );
      return __return_storage_ptr__;
    }
    lVar6 = local_268 << 5;
    uVar2 = local_268;
    for (lVar4 = 0; uVar5 - uVar9 != lVar4; lVar4 = lVar4 + 1) {
      if (edits.
          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar9 + lVar4] != kMatch) {
        uVar5 = uVar9 + lVar4;
        break;
      }
      uVar2 = uVar2 + 1;
      lVar6 = lVar6 + 0x20;
    }
    uVar9 = uVar5;
    local_268 = local_268 + lVar4;
    sVar8 = context;
    if (local_268 < context) {
      sVar8 = local_268;
    }
    if (context < uVar2) {
      uVar2 = context;
    }
    hunk.left_start_ = local_268 + (1 - uVar2);
    local_260 = local_260 + lVar4;
    hunk.right_start_ = (1 - uVar2) + local_260;
    hunk.adds_ = 0;
    hunk.removes_ = 0;
    hunk.common_ = 0;
    hunk.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&hunk.hunk_;
    hunk.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size = 0;
    hunk.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&hunk.hunk_adds_;
    hunk.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size = 0;
    hunk.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&hunk.hunk_removes_;
    hunk.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size = 0;
    lVar6 = lVar6 + uVar2 * -0x20;
    hunk.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         hunk.hunk_.
         super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    hunk.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         hunk.hunk_adds_.
         super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    hunk.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         hunk.hunk_removes_.
         super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    while (bVar10 = sVar8 != 0, sVar8 = sVar8 - 1, bVar10) {
      anon_unknown_1::Hunk::PushLine
                (&hunk,' ',
                 *(char **)((long)&(((left->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                           + lVar6));
      lVar6 = lVar6 + 0x20;
    }
    lVar4 = uVar9 * 4;
    uVar5 = 0;
    for (; uVar9 < (ulong)((long)edits.
                                 super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)edits.
                                 super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 2); uVar9 = uVar9 + 1)
    {
      lVar4 = (lVar4 << 0x1e) >> 0x1e;
      lVar6 = lVar4;
      if (context <= uVar5) {
        while( true ) {
          if ((pointer)((long)edits.
                              super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar6) ==
              edits.
              super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001ce56a;
          if (*(pointer)((long)edits.
                               super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar6) != kMatch) break;
          lVar6 = lVar6 + 4;
        }
        if (context <= (lVar6 >> 2) - uVar9) break;
      }
      EVar1 = edits.
              super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar9];
      uVar5 = uVar5 + 1;
      if (EVar1 != kMatch) {
        uVar5 = 0;
      }
      if ((EVar1 < 4) && (EVar1 != kAdd)) {
        edit = '-';
        if (EVar1 == kMatch) {
          edit = ' ';
        }
        anon_unknown_1::Hunk::PushLine
                  (&hunk,edit,
                   (left->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[local_268]._M_dataplus._M_p);
      }
      if ((EVar1 & ~kRemove) == kAdd) {
        anon_unknown_1::Hunk::PushLine
                  (&hunk,'+',
                   (right->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[local_260]._M_dataplus._M_p);
      }
      local_268 = local_268 + (EVar1 != kAdd);
      local_260 = local_260 + (ulong)(EVar1 != kRemove);
      lVar4 = lVar4 + 4;
    }
LAB_001ce56a:
    if (hunk.removes_ == 0 && hunk.adds_ == 0) {
      anon_unknown_1::Hunk::~Hunk(&hunk);
      goto LAB_001ce6c6;
    }
    std::operator<<(local_1a8,"@@ ");
    if (hunk.removes_ != 0) {
      poVar3 = std::operator<<(local_1a8,"-");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,",");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      if (hunk.adds_ != 0 && hunk.removes_ != 0) {
        std::operator<<(local_1a8," ");
      }
    }
    if (hunk.adds_ != 0) {
      poVar3 = std::operator<<(local_1a8,"+");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,",");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    }
    std::operator<<(local_1a8," @@\n");
    anon_unknown_1::Hunk::FlushEdits(&hunk);
    p_Var7 = (_List_node_base *)&hunk.hunk_;
    while (p_Var7 = (((_List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                       *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var7 != (_List_node_base *)&hunk.hunk_) {
      poVar3 = std::operator<<(local_1a8,*(char *)&p_Var7[1]._M_next);
      poVar3 = std::operator<<(poVar3,(char *)p_Var7[1]._M_prev);
      std::operator<<(poVar3,"\n");
    }
    anon_unknown_1::Hunk::~Hunk(&hunk);
  } while( true );
}

Assistant:

std::string CreateUnifiedDiff(const std::vector<std::string>& left,
                              const std::vector<std::string>& right,
                              size_t context) {
  const std::vector<EditType> edits = CalculateOptimalEdits(left, right);

  size_t l_i = 0, r_i = 0, edit_i = 0;
  std::stringstream ss;
  while (edit_i < edits.size()) {
    // Find first edit.
    while (edit_i < edits.size() && edits[edit_i] == kMatch) {
      ++l_i;
      ++r_i;
      ++edit_i;
    }

    // Find the first line to include in the hunk.
    const size_t prefix_context = std::min(l_i, context);
    Hunk hunk(l_i - prefix_context + 1, r_i - prefix_context + 1);
    for (size_t i = prefix_context; i > 0; --i) {
      hunk.PushLine(' ', left[l_i - i].c_str());
    }

    // Iterate the edits until we found enough suffix for the hunk or the input
    // is over.
    size_t n_suffix = 0;
    for (; edit_i < edits.size(); ++edit_i) {
      if (n_suffix >= context) {
        // Continue only if the next hunk is very close.
        auto it = edits.begin() + static_cast<int>(edit_i);
        while (it != edits.end() && *it == kMatch) ++it;
        if (it == edits.end() ||
            static_cast<size_t>(it - edits.begin()) - edit_i >= context) {
          // There is no next edit or it is too far away.
          break;
        }
      }

      EditType edit = edits[edit_i];
      // Reset count when a non match is found.
      n_suffix = edit == kMatch ? n_suffix + 1 : 0;

      if (edit == kMatch || edit == kRemove || edit == kReplace) {
        hunk.PushLine(edit == kMatch ? ' ' : '-', left[l_i].c_str());
      }
      if (edit == kAdd || edit == kReplace) {
        hunk.PushLine('+', right[r_i].c_str());
      }

      // Advance indices, depending on edit type.
      l_i += edit != kAdd;
      r_i += edit != kRemove;
    }

    if (!hunk.has_edits()) {
      // We are done. We don't want this hunk.
      break;
    }

    hunk.PrintTo(&ss);
  }
  return ss.str();
}